

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

long xmlTextReaderByteConsumed(xmlTextReaderPtr reader)

{
  xmlParserInputPtr pxVar1;
  xmlParserInputPtr in;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->ctxt == (xmlParserCtxtPtr)0x0)) {
    reader_local = (xmlTextReaderPtr)0xffffffffffffffff;
  }
  else {
    pxVar1 = reader->ctxt->input;
    if (pxVar1 == (xmlParserInputPtr)0x0) {
      reader_local = (xmlTextReaderPtr)0xffffffffffffffff;
    }
    else {
      reader_local = (xmlTextReaderPtr)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
    }
  }
  return (long)reader_local;
}

Assistant:

long
xmlTextReaderByteConsumed(xmlTextReaderPtr reader) {
    xmlParserInputPtr in;

    if ((reader == NULL) || (reader->ctxt == NULL))
        return(-1);
    in = reader->ctxt->input;
    if (in == NULL)
        return(-1);
    return(in->consumed + (in->cur - in->base));
}